

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O3

void * OPENSSL_lh_delete(_LHASH *lh,void *data,lhash_hash_func_helper call_hash_func,
                        lhash_cmp_func_helper call_cmp_func)

{
  LHASH_ITEM *orig_ptr;
  LHASH_ITEM **ppLVar1;
  void *pvVar2;
  
  pvVar2 = (void *)0x0;
  ppLVar1 = get_next_ptr_and_hash(lh,(uint32_t *)0x0,data,call_hash_func,call_cmp_func);
  orig_ptr = *ppLVar1;
  if (orig_ptr != (LHASH_ITEM *)0x0) {
    *ppLVar1 = orig_ptr->next;
    pvVar2 = orig_ptr->data;
    OPENSSL_free(orig_ptr);
    lh->num_items = lh->num_items - 1;
    lh_maybe_resize(lh);
  }
  return pvVar2;
}

Assistant:

void *OPENSSL_lh_delete(_LHASH *lh, const void *data,
                        lhash_hash_func_helper call_hash_func,
                        lhash_cmp_func_helper call_cmp_func) {
  LHASH_ITEM **next_ptr, *item, *ret;

  next_ptr =
      get_next_ptr_and_hash(lh, NULL, data, call_hash_func, call_cmp_func);

  if (*next_ptr == NULL) {
    // No such element.
    return NULL;
  }

  item = *next_ptr;
  *next_ptr = item->next;
  ret = reinterpret_cast<LHASH_ITEM *>(item->data);
  OPENSSL_free(item);

  lh->num_items--;
  lh_maybe_resize(lh);

  return ret;
}